

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::resetColImpliedBounds(HPresolve *this,HighsInt col,HighsInt row)

{
  reference pvVar1;
  reference pvVar2;
  int in_EDX;
  int in_ESI;
  key_type_conflict1 *in_RDI;
  HighsInt in_stack_000000dc;
  double in_stack_000000e0;
  HighsInt in_stack_000000ec;
  HPresolve *in_stack_000000f0;
  
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x178),
                      (long)in_ESI);
  if (*pvVar1 == '\0') {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x70),(long)in_ESI);
    if ((*pvVar2 != -1) &&
       ((in_EDX == -1 ||
        (pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x70),(long)in_ESI),
        *pvVar2 == in_EDX)))) {
      changeImplColLower(in_stack_000000f0,in_stack_000000ec,in_stack_000000e0,in_stack_000000dc);
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x76),(long)in_ESI);
    if ((*pvVar2 != -1) &&
       ((in_EDX == -1 ||
        (pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x76),(long)in_ESI),
        *pvVar2 == in_EDX)))) {
      changeImplColUpper(in_stack_000000f0,in_stack_000000ec,in_stack_000000e0,in_stack_000000dc);
    }
  }
  else if ((in_EDX != -1) &&
          (pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               (in_RDI + 0x172),(long)in_EDX), *pvVar1 == '\0')) {
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)(in_RDI + 0xa0),(long)in_EDX);
    std::set<int,_std::less<int>,_std::allocator<int>_>::erase
              ((set<int,_std::less<int>,_std::allocator<int>_> *)CONCAT44(in_ESI,in_EDX),in_RDI);
  }
  return;
}

Assistant:

void HPresolve::resetColImpliedBounds(HighsInt col, HighsInt row) {
  assert(row == -1 || colLowerSource[col] == row || colUpperSource[col] == row);
  if (!colDeleted[col]) {
    // set implied bounds to infinite values if (1) they were deduced from the
    // given row or (2) no row was given
    if (colLowerSource[col] != -1 && (row == -1 || colLowerSource[col] == row))
      changeImplColLower(col, -kHighsInf, -1);
    if (colUpperSource[col] != -1 && (row == -1 || colUpperSource[col] == row))
      changeImplColUpper(col, kHighsInf, -1);
  } else if (row != -1 && !rowDeleted[row]) {
    // remove column from row-wise implied bound storage
    colImplSourceByRow[row].erase(col);
  }
}